

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  initializer_list<unsigned_short> __l;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  P2PSocket *pPVar4;
  Events *pEVar5;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar6;
  pointer pEVar7;
  size_type sVar8;
  reference puVar9;
  Peers *pPVar10;
  ostream *poVar11;
  Peer *this_00;
  function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *this_01;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  PeerException *e_3;
  PeersReadMessage *local_2c8;
  PeersReadMessage *msg;
  iterator __end3;
  iterator __begin3;
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *__range3;
  undefined1 local_288 [40];
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> msgs;
  allocator<char> local_229;
  string local_228;
  int local_208;
  int local_204;
  int bytes;
  int peersCount;
  P2PSocketException *e_2;
  string local_1d0 [38];
  unsigned_short local_1aa;
  iterator iStack_1a8;
  unsigned_short port;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  P2PSocketException *e_1;
  int connected;
  int total;
  Event local_158;
  anon_class_1_0_00000001 local_111;
  function<void_(Peer_*)> local_110;
  Event local_f0;
  P2PSocketException *e;
  string local_80;
  P2PSocket *local_60;
  P2PSocket *sock;
  undefined1 local_43 [27];
  vector<unsigned_short,_std::allocator<unsigned_short>_> knownPorts;
  char **argv_local;
  int argc_local;
  
  local_43._1_2_ = 0x22ba;
  local_43._3_8_ = local_43 + 1;
  local_43._11_8_ = 1;
  this_01 = (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)local_43;
  knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)this_01);
  __l._M_len = local_43._11_8_;
  __l._M_array = (iterator)local_43._3_8_;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_43 + 0x13),__l,
             (allocator_type *)this_01);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)local_43);
  pPVar4 = (P2PSocket *)operator_new(0xb0);
  P2PSocket::P2PSocket(pPVar4,2,false);
  local_60 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"127.0.0.1",(allocator<char> *)((long)&e + 7));
  P2PSocket::createServer(pPVar4,&local_80,0x1a66);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  pEVar5 = P2PSocket::events(local_60);
  puVar6 = Events::onPeerConnect(pEVar5);
  pEVar7 = std::unique_ptr<Event,_std::default_delete<Event>_>::operator->(puVar6);
  std::function<void(Peer*)>::function<main::__0,void>
            ((function<void(Peer*)> *)&local_110,&local_111);
  Event::listen(&local_f0,(int)pEVar7,(int)&local_110);
  Event::~Event(&local_f0);
  std::function<void_(Peer_*)>::~function(&local_110);
  pEVar5 = P2PSocket::events(local_60);
  puVar6 = Events::onPeerDisconnect(pEVar5);
  pEVar7 = std::unique_ptr<Event,_std::default_delete<Event>_>::operator->(puVar6);
  std::function<void(Peer*)>::function<main::__1,void>
            ((function<void(Peer*)> *)&total,(anon_class_1_0_00000001 *)((long)&connected + 3));
  Event::listen(&local_158,(int)pEVar7,(int)(function<void(Peer*)> *)&total);
  Event::~Event(&local_158);
  std::function<void_(Peer_*)>::~function((function<void_(Peer_*)> *)&total);
  sVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_43 + 0x13));
  e_1._4_4_ = 0;
  signal(0xd,(__sighandler_t)0x1);
  uVar12 = extraout_RDX;
  do {
    P2PSocket::listen(local_60,0,(int)uVar12);
    std::operator<<((ostream *)&std::cout,"listening\n");
    __end2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_43 + 0x13)
                       );
    iStack_1a8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_43 + 0x13));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe58);
      if (!bVar1) break;
      puVar9 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end2);
      pPVar4 = local_60;
      local_1aa = *puVar9;
      if (e_1._4_4_ < (int)sVar8) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1d0,"127.0.0.1",(allocator<char> *)((long)&e_2 + 7));
        P2PSocket::connect(pPVar4,(int)local_1d0,(sockaddr *)(ulong)local_1aa,(socklen_t)this_01);
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
        e_1._4_4_ = e_1._4_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end2);
    }
    pPVar10 = P2PSocket::peers(local_60);
    local_204 = Peers::count(pPVar10);
    if (0 < local_204) {
      pPVar10 = P2PSocket::peers(local_60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"Broadcasting...",&local_229);
      this = &msgs.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      std::function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>::function
                ((function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)this,
                 (nullptr_t)0x0);
      iVar3 = Peers::broadcast(pPVar10,&local_228,
                               (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>
                                *)this);
      std::function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>::~function
                ((function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)
                 &msgs.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      local_208 = iVar3;
      poVar11 = std::operator<<((ostream *)&std::cout,"Sent: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_208);
      std::operator<<(poVar11," msgs\n");
      pPVar10 = P2PSocket::peers(local_60);
      this_01 = (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)
                &__range3;
      std::function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>::function
                (this_01,(nullptr_t)0x0);
      Peers::read((Peers *)local_288,(int)pPVar10,(void *)0x400,(size_t)this_01);
      PeersMessages::all((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)
                         (local_288 + 0x20),(PeersMessages *)local_288);
      PeersMessages::~PeersMessages((PeersMessages *)local_288);
      std::function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>::~function
                ((function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)
                 &__range3);
      __end3 = std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::begin
                         ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)
                          (local_288 + 0x20));
      msg = (PeersReadMessage *)
            std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::end
                      ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)
                       (local_288 + 0x20));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<PeersReadMessage_*,_std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>_>
                                    *)&msg);
        if (!bVar1) break;
        local_2c8 = __gnu_cxx::
                    __normal_iterator<PeersReadMessage_*,_std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>_>
                    ::operator*(&__end3);
        poVar11 = std::operator<<((ostream *)&std::cout,"Recieved message: ");
        PeersReadMessage::message_abi_cxx11_((string *)&e_3,local_2c8);
        poVar11 = std::operator<<(poVar11,(string *)&e_3);
        poVar11 = std::operator<<(poVar11," from ");
        this_00 = PeersReadMessage::peer(local_2c8);
        uVar2 = Peer::port(this_00);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar2);
        std::operator<<(poVar11,"\n");
        std::__cxx11::string::~string((string *)&e_3);
        __gnu_cxx::
        __normal_iterator<PeersReadMessage_*,_std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>_>
        ::operator++(&__end3);
      }
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector
                ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)(local_288 + 0x20));
    }
    poVar11 = std::operator<<((ostream *)&std::cout,"Sleeping...");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,e_1._4_4_);
    std::operator<<(poVar11,"\n");
    sleep(2);
    uVar12 = extraout_RDX_00;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    std::vector<uint16_t> knownPorts = {
        8890,
    };

    P2PSocket *sock;

    try {
        sock = new P2PSocket(2);
        sock->createServer("127.0.0.1", 6758);
    } catch(P2PSocketException &e) {
        std::cout << e.what() << std::endl;
    }

    sock->events()->onPeerConnect()->listen(
        [](auto &&) { std::cout << "A new peer connected" << std::endl; });
    sock->events()->onPeerDisconnect()->listen(
        [](auto &&) { std::cout << "A peer disconnected" << std::endl; });

    int total = knownPorts.size();
    int connected = 0;
    signal(SIGPIPE, SIG_IGN);

    while (true) {
        try {
            sock->listen();
            std::cout << "listening\n";
        } catch (const P2PSocketException &e) {
            // std::cout << e.what() << std::endl;
        }

        for (auto port : knownPorts) {
            if (connected < total) {
                try {
                    sock->connect("127.0.0.1", port);
                } catch (const P2PSocketException &e) {
                    std::cout << e.what();
                }
                ++connected;
            }
        }

        auto peersCount = sock->peers()->count();

        if (peersCount > 0) {
            try {
                int bytes = sock->peers()->broadcast("Broadcasting...");
                std::cout << "Sent: " << bytes << " msgs\n";
            } catch (...) {
            }
            try {
                auto msgs = sock->peers()->read().all();
                for (const auto &msg : msgs) {
                    std::cout << "Recieved message: " << msg.message() << " from "
                              << msg.peer()->port() << "\n";
                }
            } catch (const PeerException &e) {
                std::cout << "No messages\n";
            }
        }

        std::cout << "Sleeping..." << connected << "\n";
        sleep(2);
    }

    std::cout << "Done, exiting...\n";
    return 0;
}